

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorImpl<std::pair<llvm::StringRef,llvm::StringRef>>::
emplace_back<std::pair<llvm::StringRef,llvm::StringRef>>
          (SmallVectorImpl<std::pair<llvm::StringRef,llvm::StringRef>> *this,
          pair<llvm::StringRef,_llvm::StringRef> *Args)

{
  undefined8 *puVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  
  uVar6 = *(uint *)(this + 8);
  if (*(uint *)(this + 0xc) <= uVar6) {
    SmallVectorTemplateBase<std::pair<llvm::StringRef,_llvm::StringRef>,_true>::grow
              ((SmallVectorTemplateBase<std::pair<llvm::StringRef,_llvm::StringRef>,_true> *)this,0)
    ;
    uVar6 = *(uint *)(this + 8);
  }
  lVar2 = *(long *)this;
  pcVar3 = (Args->first).Data;
  sVar4 = (Args->first).Length;
  sVar5 = (Args->second).Length;
  puVar1 = (undefined8 *)(lVar2 + 0x10 + (ulong)uVar6 * 0x20);
  *puVar1 = (Args->second).Data;
  puVar1[1] = sVar5;
  puVar1 = (undefined8 *)(lVar2 + (ulong)uVar6 * 0x20);
  *puVar1 = pcVar3;
  puVar1[1] = sVar4;
  SmallVectorBase::set_size((SmallVectorBase *)this,(ulong)*(uint *)(this + 8) + 1);
  return;
}

Assistant:

void emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->set_size(this->size() + 1);
  }